

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmPageTableMgr.h
# Opt level: O0

GmmPageTableMgr * __thiscall
GmmLib::GmmPageTableMgr::operator=(GmmPageTableMgr *this,GmmPageTableMgr *param_1)

{
  GmmPageTableMgr *param_1_local;
  GmmPageTableMgr *this_local;
  
  memcpy(&this->EngType,&param_1->EngType,0xd8);
  return this;
}

Assistant:

class GMM_LIB_API NON_PAGED_SECTION GmmPageTableMgr :
                     public GmmMemAllocator
    {
    private:
        GMM_ENGINE_TYPE EngType;             //PageTable managed @ device-level (specifies engine associated with the device)

        AuxTable* AuxTTObj;                  //Auxiliary Translation Table obj

        GMM_PAGETABLEPool *pPool;            //Common page table pool
        uint32_t NumNodePoolElements;
        GmmClientContext    *pClientContext;    ///< ClientContext of the client creating this Object

         //OS-specific defn
#if defined  __linux__
	pthread_mutex_t PoolLock;
#endif
    public:
        GMM_DEVICE_CALLBACKS DeviceCb;       //OS-specific defn: Will be used by Clients to send as input arguments for TR-TT APIs
        GMM_DEVICE_CALLBACKS_INT DeviceCbInt;       //OS-specific defn: Will be used internally GMM lib
        GMM_TRANSLATIONTABLE_CALLBACKS TTCb; //OS-specific defn
        HANDLE hCsr;  // OCL per-device command stream receiver handle for aubcapture
    public:
        GmmPageTableMgr();
        GmmPageTableMgr(GMM_DEVICE_CALLBACKS_INT *, uint32_t TTFlags, GmmClientContext  *pClientContextIn); // Allocates memory for indicate TT’s root-tables, initializes common node-pool
        
        
        //GMM_VIRTUAL GMM_GFX_ADDRESS GetTRL3TableAddr();
        GMM_VIRTUAL GMM_GFX_ADDRESS GetAuxL3TableAddr();

        //Update TT root table address in context-image
        GMM_VIRTUAL GMM_STATUS InitContextAuxTableRegister(HANDLE initialBBHandle, GMM_ENGINE_TYPE engType); //Clients call it to update Aux-Table pointer in context-image, engType reqd. if @ context level

        //Aux TT management API
        GMM_VIRTUAL GMM_STATUS UpdateAuxTable(const GMM_DDI_UPDATEAUXTABLE*);      //new API for updating Aux-Table to point to correct 16B-chunk
                                                                       //for given host page VA  when base/Aux surf is mapped/unmapped
        GMM_VIRTUAL void __ReleaseUnusedPool(GMM_UMD_SYNCCONTEXT *UmdContext);
        GMM_VIRTUAL GMM_PAGETABLEPool * __GetFreePoolNode(uint32_t * FreePoolNodeIdx, POOL_TYPE PoolType);


#if defined __linux__
        //returns number of BOs for indicated TTs = NumNodePoolElements+1 BOs for root table and pools
        GMM_VIRTUAL int GetNumOfPageTableBOs(uint8_t TTFlags);
        //returns BO* list for indicated TT in client allocated memory
        GMM_VIRTUAL int GetPageTableBOList(uint8_t TTFlags, void* BOList);
#endif

        //Destructor
        GMM_VIRTUAL ~GmmPageTableMgr();                         //Clean-up page table structures

        // Inline Functions
        /////////////////////////////////////////////////////////////////////////////////////
        /// Returns GmmClientContext associated with this PageTableMgr
        /// @return ::GmmClientContext
        /////////////////////////////////////////////////////////////////////////////////////
        GMM_INLINE_VIRTUAL GmmClientContext* GetClientContext()
        {
            return pClientContext;
        }

    private:
        GMM_PAGETABLEPool * __AllocateNodePool(uint32_t AddrAlignment, POOL_TYPE Type);

        GMM_INLINE GMM_LIB_CONTEXT *GetLibContext() 
        {
            return pClientContext->GetLibContext();
        }

    }